

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

double __thiscall
TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sucSIs)

{
  MultiAgentDecisionProcessDiscrete *pMVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double local_38;
  
  lVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
  if (lVar2 == 0) {
    local_38 = 1.0;
  }
  else {
    local_38 = 1.0;
    uVar4 = 1;
    uVar5 = 0;
    do {
      pMVar1 = (this->_m_individualMADPDs).
               super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      dVar6 = (double)(**(code **)(*(long *)&pMVar1->super_MultiAgentDecisionProcess + 0x110))
                                (pMVar1,(sIs->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar5],
                                 (aIs->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar5],
                                 (sucSIs->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar5]);
      local_38 = local_38 * dVar6;
      if ((local_38 == 0.0) && (!NAN(local_38))) {
        return local_38;
      }
      uVar5 = (ulong)uVar4;
      uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
      uVar4 = uVar4 + 1;
    } while (uVar5 < uVar3);
  }
  return local_38;
}

Assistant:

double GetTransitionProbability(const std::vector<Index> &sIs,
                                    const std::vector<Index> &aIs,
                                    const std::vector<Index> &sucSIs) const
        { 
            double p=1;
            for(Index agI = 0; agI < GetNrAgents(); agI++)
            {
                p*=GetIndividualMADPD(agI)->GetTransitionProbability(
                    sIs[agI],
                    aIs[agI],
                    sucSIs[agI]);
                if(p==0)
                    break;
            }
            return(p);
        }